

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
~DrawTestCase(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawTestCase_00bd81f0;
  std::__cxx11::string::~string((string *)&this->m_fragShaderSource);
  std::__cxx11::string::~string((string *)&this->m_vertShaderSource);
  DrawIndirectParams::~DrawIndirectParams(&this->m_data);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

DrawTestCase<T>::~DrawTestCase	(void)
{
}